

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall
deqp::gls::DrawTest::DrawTest
          (DrawTest *this,TestContext *testCtx,RenderContext *renderCtx,char *name,char *desc)

{
  TestLog *log;
  allocator<char> local_61;
  string local_60;
  char *local_30;
  char *desc_local;
  char *name_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  DrawTest *this_local;
  
  local_30 = desc;
  desc_local = name;
  name_local = (char *)renderCtx;
  renderCtx_local = (RenderContext *)testCtx;
  testCtx_local = (TestContext *)this;
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,desc);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__DrawTest_011e6080;
  this->m_renderCtx = (RenderContext *)name_local;
  this->m_refBuffers = (ReferenceContextBuffers *)0x0;
  this->m_refContext = (ReferenceContext *)0x0;
  this->m_glesContext = (Context *)0x0;
  this->m_glArrayPack = (AttributePack *)0x0;
  this->m_rrArrayPack = (AttributePack *)0x0;
  this->m_maxDiffRed = -1;
  this->m_maxDiffGreen = -1;
  this->m_maxDiffBlue = -1;
  std::vector<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>::vector
            (&this->m_specs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_iteration_descriptions);
  this->m_iteration = 0;
  log = tcu::TestContext::getLog((TestContext *)renderCtx_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Iteration result: ",&local_61);
  tcu::ResultCollector::ResultCollector(&this->m_result,log,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return;
}

Assistant:

DrawTest::DrawTest (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* desc)
	: TestCase			(testCtx, name, desc)
	, m_renderCtx		(renderCtx)
	, m_refBuffers		(DE_NULL)
	, m_refContext		(DE_NULL)
	, m_glesContext		(DE_NULL)
	, m_glArrayPack		(DE_NULL)
	, m_rrArrayPack		(DE_NULL)
	, m_maxDiffRed		(-1)
	, m_maxDiffGreen	(-1)
	, m_maxDiffBlue		(-1)
	, m_iteration		(0)
	, m_result			(testCtx.getLog(), "Iteration result: ")
{
}